

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

string * __thiscall
QWidgetPrivate::flagsForDumping_abi_cxx11_(string *__return_storage_ptr__,QWidgetPrivate *this)

{
  QWidget *this_00;
  int iVar1;
  QWidget *pQVar2;
  ostream *poVar3;
  long in_FS_OFFSET;
  stringstream s;
  char local_1d0;
  undefined7 uStack_1cf;
  size_type local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&__return_storage_ptr__->field_2 + 8) = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->_M_dataplus)._M_p = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->_M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  QObjectPrivate::flagsForDumping_abi_cxx11_();
  pQVar2 = QApplication::focusWidget();
  if (pQVar2 == this_00) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'F');
  }
  if ((this_00->data->widget_attributes & 0x8000) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_00311042:
      __stack_chk_fail();
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'I');
  }
  else {
    memset(local_1b0,0xaa,0x188);
    std::__cxx11::stringstream::stringstream(local_1b0);
    local_1d0 = '<';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1d0,1);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1);
    local_1d0 = 'x';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1d0,1);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i) + 1);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) | 0x800;
    iVar1 = QWidget::x(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    iVar1 = QWidget::y(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    local_1d0 = '>';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1d0,1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,(char *)CONCAT71(uStack_1cf,local_1d0),local_1c8);
    if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
      operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_00311042;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QWidgetPrivate::flagsForDumping() const
{
    Q_Q(const QWidget);
    std::string flags = QObjectPrivate::flagsForDumping();
    if (QApplication::focusWidget() == q)
        flags += 'F';
    if (q->isVisible()) {
        std::stringstream s;
        s << '<'
          << q->width() << 'x' << q->height()
          << std::showpos << q->x() << q->y()
          << '>';
        flags += s.str();
    } else {
        flags += 'I';
    }
    return flags;
}